

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O1

OPJ_BOOL bmp_read_rle4_data(FILE *IN,OPJ_UINT8 *pData,OPJ_UINT32 stride,OPJ_UINT32 width,
                           OPJ_UINT32 height)

{
  byte *pbVar1;
  bool bVar2;
  OPJ_UINT8 *pOVar3;
  uint uVar4;
  uint uVar5;
  OPJ_UINT8 *pOVar6;
  int iVar7;
  byte *pbVar8;
  byte bVar9;
  ulong uVar10;
  long lVar11;
  byte *pbVar12;
  uint uVar13;
  uint local_5c;
  
  pbVar12 = pData + height * stride;
  local_5c = 0;
  uVar13 = 0;
  pbVar8 = pData;
  do {
    if (height <= local_5c) {
      return local_5c;
    }
    uVar4 = getc((FILE *)IN);
    pOVar3 = (OPJ_UINT8 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) {
switchD_0010b2bc_caseD_0:
      pOVar6 = pOVar3;
      bVar2 = false;
    }
    else if (uVar4 == 0) {
      uVar4 = getc((FILE *)IN);
      pOVar6 = (OPJ_UINT8 *)(ulong)(uVar4 + 1);
      if (uVar4 + 1 < 4) {
        pOVar3 = (OPJ_UINT8 *)
                 ((long)&switchD_0010b2bc::switchdataD_00113148 +
                 (long)(int)(&switchD_0010b2bc::switchdataD_00113148)[(long)pOVar6]);
        switch(pOVar6) {
        default:
          goto switchD_0010b2bc_caseD_0;
        case (OPJ_UINT8 *)0x1:
          local_5c = local_5c + 1;
          pOVar6 = (OPJ_UINT8 *)(ulong)local_5c;
          pbVar8 = pData + local_5c * stride;
          uVar13 = 0;
          bVar2 = true;
          break;
        case (OPJ_UINT8 *)0x3:
          iVar7 = getc((FILE *)IN);
          uVar13 = iVar7 + uVar13;
          iVar7 = getc((FILE *)IN);
          local_5c = local_5c + iVar7;
          pOVar6 = pData + uVar13;
          pbVar8 = pOVar6 + local_5c * stride;
          bVar2 = true;
        }
      }
      else {
        if (((0 < (int)uVar4) && (uVar13 < width)) && (pbVar8 < pbVar12)) {
          lVar11 = 1;
          uVar10 = 0;
          pOVar6 = (OPJ_UINT8 *)0x0;
          do {
            if ((uVar10 & 1) == 0) {
              uVar5 = getc((FILE *)IN);
              pOVar6 = (OPJ_UINT8 *)(ulong)uVar5;
            }
            bVar9 = (byte)pOVar6;
            if ((uVar10 & 1) == 0) {
              bVar9 = (byte)((ulong)pOVar6 >> 4);
            }
            pbVar8[uVar10] = bVar9 & 0xf;
            uVar10 = uVar10 + 1;
          } while ((((int)lVar11 < (int)uVar4) && (uVar13 + (int)lVar11 < width)) &&
                  (pbVar1 = pbVar8 + lVar11, lVar11 = lVar11 + 1, pbVar1 < pbVar12));
          uVar13 = uVar13 + (int)uVar10;
          pbVar8 = pbVar8 + uVar10;
        }
        bVar2 = true;
        if ((uVar4 & 3) - 1 < 2) {
          uVar4 = getc((FILE *)IN);
          pOVar6 = (OPJ_UINT8 *)(ulong)uVar4;
        }
      }
    }
    else {
      uVar5 = getc((FILE *)IN);
      pOVar6 = (OPJ_UINT8 *)(ulong)uVar5;
      bVar2 = true;
      if (((0 < (int)uVar4) && (uVar13 < width)) && (pbVar8 < pbVar12)) {
        iVar7 = 1;
        bVar9 = 0;
        do {
          *pbVar8 = (byte)(uVar5 >> (~bVar9 & 4)) & 0xf;
          uVar13 = uVar13 + 1;
          pbVar8 = pbVar8 + 1;
          if (((int)uVar4 <= iVar7) || (width <= uVar13)) break;
          iVar7 = iVar7 + 1;
          bVar9 = bVar9 + 4;
        } while (pbVar8 < pbVar12);
      }
    }
    if (!bVar2) {
      return (OPJ_BOOL)pOVar6;
    }
  } while( true );
}

Assistant:

static OPJ_BOOL bmp_read_rle4_data(FILE* IN, OPJ_UINT8* pData,
                                   OPJ_UINT32 stride, OPJ_UINT32 width, OPJ_UINT32 height)
{
    OPJ_UINT32 x, y;
    OPJ_UINT8 *pix;
    const OPJ_UINT8 *beyond;

    beyond = pData + stride * height;
    pix = pData;
    x = y = 0U;
    while (y < height) {
        int c = getc(IN);
        if (c == EOF) {
            break;
        }

        if (c) { /* encoded mode */
            int j;
            OPJ_UINT8 c1 = (OPJ_UINT8)getc(IN);

            for (j = 0; (j < c) && (x < width) &&
                    ((OPJ_SIZE_T)pix < (OPJ_SIZE_T)beyond); j++, x++, pix++) {
                *pix = (OPJ_UINT8)((j & 1) ? (c1 & 0x0fU) : ((c1 >> 4) & 0x0fU));
            }
        } else { /* absolute mode */
            c = getc(IN);
            if (c == EOF) {
                break;
            }

            if (c == 0x00) { /* EOL */
                x = 0;
                y++;
                pix = pData + y * stride;
            } else if (c == 0x01) { /* EOP */
                break;
            } else if (c == 0x02) { /* MOVE by dxdy */
                c = getc(IN);
                x += (OPJ_UINT32)c;
                c = getc(IN);
                y += (OPJ_UINT32)c;
                pix = pData + y * stride + x;
            } else { /* 03 .. 255 : absolute mode */
                int j;
                OPJ_UINT8 c1 = 0U;

                for (j = 0; (j < c) && (x < width) &&
                        ((OPJ_SIZE_T)pix < (OPJ_SIZE_T)beyond); j++, x++, pix++) {
                    if ((j & 1) == 0) {
                        c1 = (OPJ_UINT8)getc(IN);
                    }
                    *pix = (OPJ_UINT8)((j & 1) ? (c1 & 0x0fU) : ((c1 >> 4) & 0x0fU));
                }
                if (((c & 3) == 1) || ((c & 3) == 2)) { /* skip padding byte */
                    getc(IN);
                }
            }
        }
    }  /* while(y < height) */
    return OPJ_TRUE;
}